

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

DPIExportSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::DPIExportSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          Token *args_1,Token *args_2,Token *args_3,Token *args_4,Token *args_5,Token *args_6,
          Token *args_7)

{
  Token keyword;
  Token c_identifier;
  Token equals;
  Token functionOrTask;
  Token name;
  Token semi;
  DPIExportSyntax *pDVar1;
  undefined8 *in_RCX;
  undefined8 *in_R8;
  undefined8 *in_R9;
  undefined8 *in_stack_00000008;
  undefined8 *in_stack_00000010;
  Token *in_stack_00000018;
  size_t in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  BumpAllocator *in_stack_ffffffffffffff08;
  undefined8 in_stack_ffffffffffffff38;
  
  pDVar1 = (DPIExportSyntax *)
           allocate(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  keyword.info = (Info *)pDVar1;
  keyword.kind = (short)in_stack_ffffffffffffff38;
  keyword._2_1_ = (char)((ulong)in_stack_ffffffffffffff38 >> 0x10);
  keyword.numFlags.raw = (char)((ulong)in_stack_ffffffffffffff38 >> 0x18);
  keyword.rawLen = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  c_identifier.info = (Info *)*in_stack_00000010;
  c_identifier._0_8_ = in_stack_00000018->info;
  equals.info = (Info *)*in_stack_00000008;
  equals._0_8_ = (DPIExportSyntax *)in_stack_00000010[1];
  functionOrTask.info = (Info *)*in_R9;
  functionOrTask._0_8_ = in_stack_00000008[1];
  name.info = (Info *)*in_R8;
  name._0_8_ = in_R9[1];
  semi.info = (Info *)*in_RCX;
  semi._0_8_ = in_R8[1];
  slang::syntax::DPIExportSyntax::DPIExportSyntax
            ((DPIExportSyntax *)in_stack_00000010[1],
             (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)*in_stack_00000010,keyword,
             *in_stack_00000018,c_identifier,equals,functionOrTask,name,semi);
  return pDVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }